

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool requiresMocing(string *text,string *macroName)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_1d0 [8];
  RegularExpression qGadgetRegExp;
  undefined1 local_f0 [8];
  RegularExpression qObjectRegExp;
  string *macroName_local;
  string *text_local;
  
  qObjectRegExp.searchstring = (char *)macroName;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = strstr(pcVar2,"Q_OBJECT");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strstr(pcVar2,"Q_GADGET");
    if (pcVar2 == (char *)0x0) {
      return false;
    }
  }
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_f0,"[\n][ \t]*Q_OBJECT[^a-zA-Z0-9_]");
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_f0,text);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)qObjectRegExp.searchstring,"Q_OBJECT");
    text_local._7_1_ = true;
    qGadgetRegExp.searchstring._0_4_ = 1;
  }
  else {
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)local_1d0,"[\n][ \t]*Q_GADGET[^a-zA-Z0-9_]");
    text_local._7_1_ = cmsys::RegularExpression::find((RegularExpression *)local_1d0,text);
    if (text_local._7_1_) {
      std::__cxx11::string::operator=((string *)qObjectRegExp.searchstring,"Q_GADGET");
    }
    qGadgetRegExp.searchstring._0_4_ = 1;
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1d0);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_f0);
  return text_local._7_1_;
}

Assistant:

static bool requiresMocing(const std::string& text, std::string &macroName)
{
  // this simple check is much much faster than the regexp
  if (strstr(text.c_str(), "Q_OBJECT") == NULL
      && strstr(text.c_str(), "Q_GADGET") == NULL)
    {
    return false;
    }

  cmsys::RegularExpression qObjectRegExp("[\n][ \t]*Q_OBJECT[^a-zA-Z0-9_]");
  if (qObjectRegExp.find(text))
    {
    macroName = "Q_OBJECT";
    return true;
    }
  cmsys::RegularExpression qGadgetRegExp("[\n][ \t]*Q_GADGET[^a-zA-Z0-9_]");
  if (qGadgetRegExp.find(text))
    {
    macroName = "Q_GADGET";
    return true;
    }
  return false;
}